

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::cmMakefile(cmMakefile *this,cmGlobalGenerator *globalGenerator,Snapshot *snapshot)

{
  cmLinkedTree<cmState::SnapshotDataType> *pcVar1;
  bool bVar2;
  cmake *pcVar3;
  cmState *this_00;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  PolicyMap local_88;
  cmState *local_68;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_60;
  PositionType local_58;
  Snapshot local_48;
  Snapshot *local_20;
  Snapshot *snapshot_local;
  cmGlobalGenerator *globalGenerator_local;
  cmMakefile *this_local;
  
  local_20 = snapshot;
  snapshot_local = (Snapshot *)globalGenerator;
  globalGenerator_local = (cmGlobalGenerator *)this;
  std::set<cmListFileContext,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>::set
            (&this->CMP0054ReportedIds);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
  ::unordered_map(&this->Targets);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->AliasTargets);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(&this->SourceFiles);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
  ::map(&this->Tests);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->LinkDirectories);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SystemIncludeDirectories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ListFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OutputFiles);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ::vector(&this->LinkLibraries);
  std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::vector
            (&this->InstallGenerators);
  std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::vector(&this->TestGenerators);
  std::__cxx11::string::string((string *)&this->ComplainFileRegularExpression);
  std::__cxx11::string::string((string *)&this->DefineFlags);
  std::__cxx11::string::string((string *)&this->DefineFlagsOrig);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector(&this->SourceGroups);
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::vector(&this->FinalPassCommands);
  this->GlobalGenerator = (cmGlobalGenerator *)snapshot_local;
  (this->StateSnapshot).Position.Position = (local_20->Position).Position;
  pcVar1 = (local_20->Position).Tree;
  (this->StateSnapshot).State = local_20->State;
  (this->StateSnapshot).Position.Tree = pcVar1;
  std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::vector
            (&this->FunctionBlockers);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->FunctionBlockerBarriers)
  ;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&this->LoopBlockCounter);
  cmsys::RegularExpression::RegularExpression(&this->cmDefineRegex);
  cmsys::RegularExpression::RegularExpression(&this->cmDefine01Regex);
  cmsys::RegularExpression::RegularExpression(&this->cmAtVarRegex);
  cmsys::RegularExpression::RegularExpression(&this->cmNamedCurly);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector(&this->UnConfiguredDirectories);
  std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::vector
            (&this->ExportBuildFileGenerators);
  std::
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ::vector(&this->EvaluationFiles);
  std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::vector
            (&this->ContextStack);
  std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::vector
            (&this->ExecutionStatusStack);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::vector(&this->ImportedTargetsOwned);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
  ::unordered_map(&this->ImportedTargets);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  ::unordered_map(&this->OutputToSource);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(&this->QtUiFilesWithOptions);
  this->IsSourceFileTryCompile = false;
  pcVar3 = GetCMakeInstance(this);
  bVar2 = cmake::GetWarnUnused(pcVar3);
  this->WarnUnused = bVar2;
  pcVar3 = GetCMakeInstance(this);
  bVar2 = cmake::GetCheckSystemVars(pcVar3);
  this->CheckSystemVars = bVar2;
  this->SuppressWatches = false;
  std::__cxx11::string::operator=((string *)&this->ComplainFileRegularExpression,"^$");
  std::__cxx11::string::operator=((string *)&this->DefineFlags," ");
  cmsys::RegularExpression::compile(&this->cmDefineRegex,"#cmakedefine[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile(&this->cmDefine01Regex,"#cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile(&this->cmAtVarRegex,"(@[A-Za-z_0-9/.+-]+@)");
  cmsys::RegularExpression::compile(&this->cmNamedCurly,"^[A-Za-z0-9/_.+-]+{");
  this_00 = cmState::Snapshot::GetState(&this->StateSnapshot);
  local_58 = (this->StateSnapshot).Position.Position;
  local_68 = (this->StateSnapshot).State;
  pcStack_60 = (this->StateSnapshot).Position.Tree;
  cmState::CreatePolicyScopeSnapshot(&local_48,this_00,this->StateSnapshot);
  (this->StateSnapshot).Position.Position = local_48.Position.Position;
  (this->StateSnapshot).State = local_48.State;
  (this->StateSnapshot).Position.Tree = local_48.Position.Tree;
  local_88.Status.super__Base_bitset<4UL>._M_w[2] = 0;
  local_88.Status.super__Base_bitset<4UL>._M_w[3] = 0;
  local_88.Status.super__Base_bitset<4UL>._M_w[0] = 0;
  local_88.Status.super__Base_bitset<4UL>._M_w[1] = 0;
  cmPolicies::PolicyMap::PolicyMap(&local_88);
  PushPolicy(this,false,&local_88);
  PushLoopBlockBarrier(this);
  this->CheckCMP0000 = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"",&local_a9);
  AddSourceGroup(this,&local_a8,"^.*$");
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"Source Files",&local_d1);
  AddSourceGroup(this,&local_d0,
                 "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|f|f90|for|fpp|ftn|m|mm|rc|def|r|odl|idl|hpj|bat)$");
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"Header Files",&local_f9);
  AddSourceGroup(this,&local_f8,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"CMake Rules",&local_121);
  AddSourceGroup(this,&local_120,"\\.rule$");
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"Resources",&local_149);
  AddSourceGroup(this,&local_148,"\\.plist$");
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"Object Files",&local_171);
  AddSourceGroup(this,&local_170,"\\.(lo|o|obj)$");
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  return;
}

Assistant:

cmMakefile::cmMakefile(cmGlobalGenerator* globalGenerator,
                       cmState::Snapshot const& snapshot)
  : GlobalGenerator(globalGenerator),
    StateSnapshot(snapshot)
{
  this->IsSourceFileTryCompile = false;

  this->WarnUnused = this->GetCMakeInstance()->GetWarnUnused();
  this->CheckSystemVars = this->GetCMakeInstance()->GetCheckSystemVars();

  this->SuppressWatches = false;

  // Setup the default include complaint regular expression (match nothing).
  this->ComplainFileRegularExpression = "^$";

  this->DefineFlags = " ";

  this->cmDefineRegex.compile("#cmakedefine[ \t]+([A-Za-z_0-9]*)");
  this->cmDefine01Regex.compile("#cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  this->cmAtVarRegex.compile("(@[A-Za-z_0-9/.+-]+@)");
  this->cmNamedCurly.compile("^[A-Za-z0-9/_.+-]+{");

  this->StateSnapshot = this->StateSnapshot.GetState()
      ->CreatePolicyScopeSnapshot(this->StateSnapshot);

  // Enter a policy level for this directory.
  this->PushPolicy();

  // push empty loop block
  this->PushLoopBlockBarrier();

  // By default the check is not done.  It is enabled by
  // cmListFileCache in the top level if necessary.
  this->CheckCMP0000 = false;

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->AddSourceGroup("", "^.*$");
  this->AddSourceGroup
    ("Source Files",
     "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|f|f90|for|fpp"
     "|ftn|m|mm|rc|def|r|odl|idl|hpj|bat)$");
  this->AddSourceGroup("Header Files", CM_HEADER_REGEX);
  this->AddSourceGroup("CMake Rules", "\\.rule$");
  this->AddSourceGroup("Resources", "\\.plist$");
  this->AddSourceGroup("Object Files", "\\.(lo|o|obj)$");
#endif
}